

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.h
# Opt level: O2

TypedAttribute<Imf_2_5::Rational> * __thiscall
Imf_2_5::Header::typedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::Rational>>(Header *this,char *name)

{
  Attribute *pAVar1;
  TypedAttribute<Imf_2_5::Rational> *pTVar2;
  TypeExc *this_00;
  
  pAVar1 = operator[](this,name);
  pTVar2 = (TypedAttribute<Imf_2_5::Rational> *)
           __dynamic_cast(pAVar1,&Attribute::typeinfo,&TypedAttribute<Imf_2_5::Rational>::typeinfo,0
                         );
  if (pTVar2 != (TypedAttribute<Imf_2_5::Rational> *)0x0) {
    return pTVar2;
  }
  this_00 = (TypeExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::TypeExc::TypeExc(this_00,"Unexpected attribute type.");
  __cxa_throw(this_00,&Iex_2_5::TypeExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

T &
Header::typedAttribute (const char name[])
{
    Attribute *attr = &(*this)[name];
    T *tattr = dynamic_cast <T*> (attr);

    if (tattr == 0)
	throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return *tattr;
}